

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Range.hpp
# Opt level: O2

uint __thiscall binlog::Range::read<unsigned_int>(Range *this)

{
  uint uVar1;
  
  throw_if_overflow(this,4);
  uVar1 = *(uint *)this->_begin;
  this->_begin = (char *)((long)this->_begin + 4);
  return uVar1;
}

Assistant:

T read()
  {
    static_assert(std::is_trivially_copyable<T>::value, "T must be trivially copyable");

    throw_if_overflow(sizeof(T));

    T dst;
    memcpy(&dst, _begin, sizeof(T));
    _begin += sizeof(T);

    return dst;
  }